

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

ON_4dPoint * __thiscall
ON_XMLVariant::As4dPoint(ON_4dPoint *__return_storage_ptr__,ON_XMLVariant *this)

{
  ON_XMLVariantPrivate *pOVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  
  dVar4 = ON_4dPoint::Zero.w;
  dVar3 = ON_4dPoint::Zero.y;
  dVar2 = ON_4dPoint::Zero.x;
  pOVar1 = this->_private;
  switch(pOVar1->_type) {
  case String:
    bVar5 = ON_wString::IsValid4dPoint(&pOVar1->_string_val);
    if (bVar5) {
      (*this->_vptr_ON_XMLVariant[0x31])(this,4);
    }
    break;
  case DoubleArray2:
    (pOVar1->field_2).m_xform.m_xform[0][2] = 0.0;
  case DoubleArray3:
    (this->_private->field_2).m_xform.m_xform[0][3] = 0.0;
    break;
  case DoubleArray4:
  case DoubleColor4:
    break;
  default:
    __return_storage_ptr__->z = ON_4dPoint::Zero.z;
    __return_storage_ptr__->w = dVar4;
    __return_storage_ptr__->x = dVar2;
    __return_storage_ptr__->y = dVar3;
    return __return_storage_ptr__;
  }
  pOVar1 = this->_private;
  ON_4dPoint::ON_4dPoint
            (__return_storage_ptr__,(pOVar1->field_2)._double_val,
             (pOVar1->field_2).m_xform.m_xform[0][1],(pOVar1->field_2).m_xform.m_xform[0][2],
             (pOVar1->field_2).m_xform.m_xform[0][3]);
  return __return_storage_ptr__;
}

Assistant:

ON_4dPoint ON_XMLVariant::As4dPoint(void) const
{
  switch (_private->_type)
  {
  case Types::DoubleArray2:
    _private->_array_val[2] = 0.0;
  case Types::DoubleArray3:
    _private->_array_val[3] = 0.0;
    break;

  case Types::DoubleArray4:
  case Types::DoubleColor4:
    break;

  case Types::String:
    if (_private->_string_val.IsValid4dPoint())
      StringToPoint(4);
    break;

  default:
    return ON_4dPoint::Zero;
  }

  return ON_4dPoint(_private->_array_val[0], _private->_array_val[1], _private->_array_val[2], _private->_array_val[3]);
}